

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::bitmaskI32x4(Literal *__return_storage_ptr__,Literal *this)

{
  int32_t iVar1;
  Literal *in_RDX;
  uint uVar2;
  Literal *this_00;
  size_t i;
  long lVar3;
  undefined1 local_90 [8];
  LaneArray<4> lanes;
  
  this_00 = (Literal *)local_90;
  getLanes<int,4>((LaneArray<4> *)this_00,(wasm *)this,in_RDX);
  uVar2 = 0;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    iVar1 = geti32(this_00);
    uVar2 = uVar2 | iVar1 >> 0x1f & 1 << ((byte)lVar3 & 0x1f);
    this_00 = this_00 + 1;
  }
  (__return_storage_ptr__->field_0).i32 = uVar2;
  (__return_storage_ptr__->type).id = 2;
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)local_90);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::bitmaskI32x4() const {
  return bitmask<4, &Literal::getLanesI32x4>(*this);
}